

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O3

uint __thiscall
Js::SourceDynamicProfileManager::SaveToProfileCacheAndRelease
          (SourceDynamicProfileManager *this,SourceContextInfo *info)

{
  return 0;
}

Assistant:

uint SourceDynamicProfileManager::SaveToProfileCacheAndRelease(SourceContextInfo* info)
    {
        uint bytesWritten = 0;
#ifdef ENABLE_WININET_PROFILE_DATA_CACHE
        if(dataCacheWrapper)
        {
            if(ShouldSaveToProfileCache(info))
            {
                OUTPUT_TRACE(Js::DynamicProfilePhase, _u("Saving profile. Number of functions: %d Url: %s...\n"), startupFunctions->Length(), info->url);

                bytesWritten = SaveToProfileCache();

                if (bytesWritten == 0)
                {
                    OUTPUT_TRACE(Js::DynamicProfilePhase, _u("Profile saving FAILED\n"));
                }
                else
                {
                    OUTPUT_TRACE(Js::DynamicProfilePhase, _u("Profile saving succeeded. Bytes written: %d\n"), bytesWritten);
                }
            }

            if (!isNonCachableScript)
            {
                if (FAILED(dataCacheWrapper->SaveWriteStream()))
                {
                    return 0;
                }
            }
            dataCacheWrapper = nullptr;
        }
#endif
        return bytesWritten;
    }